

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall
GameEngine::fillMapPattern
          (GameEngine *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *cells)

{
  cellType cVar1;
  size_t sVar2;
  size_t __n;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar3;
  size_t column;
  ulong uVar4;
  element_type *this_00;
  long lVar5;
  size_t row;
  ulong index;
  allocator_type local_49;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  this_00 = (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (element_type *)0x0) {
    generateMap(this);
    this_00 = (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  sVar2 = Map::getHeight(this_00);
  __n = Map::getWidth((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,__n,&local_49);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_fill_assign(cells,sVar2,(value_type *)&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  index = 0;
  while( true ) {
    sVar2 = Map::getHeight((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar2 <= index) break;
    lVar5 = 0;
    uVar4 = 0;
    while( true ) {
      sVar2 = Map::getWidth((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (sVar2 <= uVar4) break;
      pvVar3 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,index);
      cVar1 = CellType::getType(*(CellType **)
                                 ((long)&(((pvVar3->
                                           super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>).
                                         _M_ptr + lVar5 * 4));
      *(cellType *)
       (*(long *)&(cells->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[index].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data +
       lVar5) = cVar1;
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 4;
    }
    index = index + 1;
  }
  return;
}

Assistant:

void GameEngine::fillMapPattern(std::vector<std::vector<int32_t> > &cells) {
  if (map == nullptr) {
    generateMap();
  }

  cells.assign(map->getHeight(), std::vector<int32_t>(map->getWidth()));

  for (size_t row = 0; row < map->getHeight(); ++row) {
    for (size_t column = 0; column < map->getWidth(); ++column) {
      cells[row][column] = static_cast<int32_t>((*map)[row][column]->getType());
    }
  }
}